

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O2

void getPath(long path)

{
  int iVar1;
  long lVar2;
  undefined1 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  int iVar6;
  long lVar7;
  undefined8 auStack_16f8 [158];
  int prevChecked [1152];
  
  for (lVar2 = 0; lVar2 != 0x480; lVar2 = lVar2 + 1) {
    prevChecked[lVar2] = 0;
  }
  *(undefined4 *)(path + 8) = 0;
  puVar3 = &stack0x00000054;
  iVar1 = 0;
  lVar2 = 0;
  do {
    iVar6 = 0;
    if (lVar2 == 0x10) {
LAB_0010281b:
      puVar4 = (undefined8 *)&stack0x00000008;
      puVar5 = auStack_16f8;
      for (lVar2 = 0x9e; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar5 = *puVar4;
        puVar4 = puVar4 + 1;
        puVar5 = puVar5 + 1;
      }
      pathSolve(path,prevChecked,1,iVar6);
      return;
    }
    for (lVar7 = 0; lVar7 != 0x48; lVar7 = lVar7 + 1) {
      if (puVar3[lVar7] == '$') {
        prevChecked[0] = (int)lVar7 - iVar1;
        iVar6 = prevChecked[0];
        goto LAB_0010281b;
      }
    }
    lVar2 = lVar2 + 1;
    iVar1 = iVar1 + -0x48;
    puVar3 = puVar3 + 0x49;
  } while( true );
}

Assistant:

void getPath(struct Path *path, struct Map map) {
    int i, j;
    int count = 0;
    int position = 0;
    int prevChecked[MAP_ROWS * MAP_COLS];

    for (i = 0; i < (MAP_ROWS * MAP_COLS); i++)
        prevChecked[i] = 0;
    path->count = 0;
    for (i = 0; i < MAP_ROWS; i++) {
        for (j = 0; j < MAP_COLS; j++) {
            if (map.overlay[i][j] == '$') {
                position = (i * MAP_COLS) + j;
                count = 0;
                prevChecked[count] = position;
                goto outer;
            }
        }
    }

    outer:
    pathSolve(map, path, prevChecked, count + 1, position);

    return;
}